

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool VerifyTaprootCommitment
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *control,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *program,uint256 *tapleaf_hash)

{
  span<const_unsigned_char,_18446744073709551615UL> bytes;
  span<const_unsigned_char,_18446744073709551615UL> bytes_00;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  uint256 *in_RDX;
  XOnlyPubKey *in_RSI;
  XOnlyPubKey *in_RDI;
  long in_FS_OFFSET;
  uint256 merkle_root;
  XOnlyPubKey q;
  XOnlyPubKey p;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffef8;
  XOnlyPubKey *this;
  Span<const_unsigned_char> *__range;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_ffffffffffffff08;
  Span<const_unsigned_char> *this_00;
  size_t in_stack_ffffffffffffff10;
  pointer puVar4;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff18;
  undefined1 parity;
  Span<const_unsigned_char> in_stack_ffffffffffffff50;
  undefined1 local_98 [80];
  Span<const_unsigned_char> local_48 [2];
  uchar local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (in_stack_fffffffffffffef8);
  if (sVar3 < 0x21) {
    __assert_fail("control.size() >= TAPROOT_CONTROL_BASE_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x745,
                  "bool VerifyTaprootCommitment(const std::vector<unsigned char> &, const std::vector<unsigned char> &, const uint256 &)"
                 );
  }
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (in_stack_fffffffffffffef8);
  uVar2 = base_blob<256U>::size();
  if (uVar2 <= sVar3) {
    __range = (Span<const_unsigned_char> *)0x0;
    this = (XOnlyPubKey *)local_98;
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffff08,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,this);
    parity = (undefined1)(sVar3 >> 0x38);
    local_98._16_16_ =
         (undefined1  [16])
         Span<const_unsigned_char>::subspan
                   ((Span<const_unsigned_char> *)in_stack_ffffffffffffff18._M_extent_value,
                    in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    std::span<const_unsigned_char,_18446744073709551615UL>::span<Span<const_unsigned_char>_>
              (in_stack_ffffffffffffff08,__range);
    puVar4 = local_28;
    bytes._M_extent._M_extent_value = in_stack_ffffffffffffff18._M_extent_value;
    bytes._M_ptr = puVar4;
    XOnlyPubKey::XOnlyPubKey(this,bytes);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
              (in_stack_ffffffffffffff08,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__range);
    this_00 = local_48;
    bytes_00._M_extent._M_extent_value = in_stack_ffffffffffffff18._M_extent_value;
    bytes_00._M_ptr = puVar4;
    XOnlyPubKey::XOnlyPubKey(this,bytes_00);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__range,this);
    ComputeTaprootMerkleRoot(in_stack_ffffffffffffff50,(uint256 *)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)__range);
    bVar1 = XOnlyPubKey::CheckTapTweak(in_RDI,in_RSI,in_RDX,(bool)parity);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return bVar1;
    }
    __stack_chk_fail();
  }
  __assert_fail("program.size() >= uint256::size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                ,0x746,
                "bool VerifyTaprootCommitment(const std::vector<unsigned char> &, const std::vector<unsigned char> &, const uint256 &)"
               );
}

Assistant:

static bool VerifyTaprootCommitment(const std::vector<unsigned char>& control, const std::vector<unsigned char>& program, const uint256& tapleaf_hash)
{
    assert(control.size() >= TAPROOT_CONTROL_BASE_SIZE);
    assert(program.size() >= uint256::size());
    //! The internal pubkey (x-only, so no Y coordinate parity).
    const XOnlyPubKey p{Span{control}.subspan(1, TAPROOT_CONTROL_BASE_SIZE - 1)};
    //! The output pubkey (taken from the scriptPubKey).
    const XOnlyPubKey q{program};
    // Compute the Merkle root from the leaf and the provided path.
    const uint256 merkle_root = ComputeTaprootMerkleRoot(control, tapleaf_hash);
    // Verify that the output pubkey matches the tweaked internal pubkey, after correcting for parity.
    return q.CheckTapTweak(p, merkle_root, control[0] & 1);
}